

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O1

void __thiscall
deqp::gls::FboUtil::ValidStatusCodes::addViolation
          (ValidStatusCodes *this,
          vector<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
          *dst,GLenum code,char *description)

{
  pointer pRVar1;
  bool bVar2;
  pointer pRVar3;
  int iVar4;
  int iVar6;
  pointer pRVar7;
  RuleViolation violation;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  size_t local_30;
  int iVar5;
  
  pRVar7 = (dst->
           super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar5 = (int)((ulong)((long)(dst->
                              super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar7) >> 3);
  iVar4 = iVar5 * -0x49249249;
  bVar2 = 0 < iVar4;
  if (0 < iVar4) {
    if (pRVar7->errorCode != code) {
      iVar6 = 0;
      pRVar3 = pRVar7;
      do {
        if (iVar4 + -1 == iVar6) goto LAB_0182940b;
        pRVar7 = pRVar3 + 1;
        iVar6 = iVar6 + 1;
        pRVar1 = pRVar3 + 1;
        pRVar3 = pRVar7;
      } while (pRVar1->errorCode != code);
      bVar2 = SBORROW4(iVar6,iVar4) != iVar6 + iVar5 * 0x49249249 < 0;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_60,description,(allocator<char> *)&local_80);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&pRVar7->rules,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_60._4_4_,local_60._0_4_) != &local_50) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_60._4_4_,local_60._0_4_),
                      CONCAT44(local_50._M_allocated_capacity._4_4_,
                               local_50._M_allocated_capacity._0_4_) + 1);
    }
    if (bVar2) {
      return;
    }
  }
LAB_0182940b:
  local_40 = &local_50;
  local_50._M_allocated_capacity._0_4_ = 0;
  local_50._8_8_ = 0;
  local_30 = 0;
  local_60._0_4_ = code;
  local_38 = local_40;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,description,&local_81);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)(local_60 + 8),&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
  ::push_back(dst,(value_type *)local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_60 + 8));
  return;
}

Assistant:

void ValidStatusCodes::addViolation (std::vector<RuleViolation>& dst, glw::GLenum code, const char* description) const
{
	// rule violation already exists?
	for (int ndx = 0; ndx < (int)dst.size(); ++ndx)
	{
		if (dst[ndx].errorCode == code)
		{
			dst[ndx].rules.insert(std::string(description));
			return;
		}
	}

	// new violation
	{
		RuleViolation violation;

		violation.errorCode = code;
		violation.rules.insert(std::string(description));

		dst.push_back(violation);
	}
}